

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.h
# Opt level: O2

int_mv av1_get_ref_mv_from_stack
                 (int ref_idx,MV_REFERENCE_FRAME *ref_frame,int ref_mv_idx,
                 MB_MODE_INFO_EXT *mbmi_ext)

{
  byte bVar1;
  char cVar2;
  int_mv *piVar3;
  long lVar4;
  
  bVar1 = ref_frame[1];
  cVar2 = *ref_frame;
  if ((char)bVar1 < '\x01') {
    piVar3 = mbmi_ext->global_mvs + cVar2;
    if (ref_mv_idx < (int)(uint)mbmi_ext->ref_mv_count[cVar2]) {
      piVar3 = &mbmi_ext->ref_mv_stack[cVar2][ref_mv_idx].this_mv;
    }
  }
  else {
    if (bVar1 < 5 || '\x04' < cVar2) {
      for (lVar4 = 0; lVar4 != 9; lVar4 = lVar4 + 1) {
        if ((cVar2 == (&comp_ref0_lut)[lVar4]) && (bVar1 == (&comp_ref1_lut)[lVar4])) {
          cVar2 = (char)lVar4 + '\x14';
          goto LAB_001962a8;
        }
      }
    }
    cVar2 = bVar1 * '\x04' + cVar2 + -0xd;
LAB_001962a8:
    piVar3 = &mbmi_ext->ref_mv_stack[cVar2][ref_mv_idx].comp_mv;
    if (ref_idx == 0) {
      piVar3 = &mbmi_ext->ref_mv_stack[cVar2][ref_mv_idx].this_mv;
    }
  }
  return (int_mv)(*piVar3).as_int;
}

Assistant:

static inline int8_t av1_ref_frame_type(const MV_REFERENCE_FRAME *const rf) {
  if (rf[1] > INTRA_FRAME) {
    const int8_t uni_comp_ref_idx = get_uni_comp_ref_idx(rf);
    if (uni_comp_ref_idx >= 0) {
      assert((REF_FRAMES + FWD_REFS * BWD_REFS + uni_comp_ref_idx) <
             MODE_CTX_REF_FRAMES);
      return REF_FRAMES + FWD_REFS * BWD_REFS + uni_comp_ref_idx;
    } else {
      return REF_FRAMES + FWD_RF_OFFSET(rf[0]) +
             BWD_RF_OFFSET(rf[1]) * FWD_REFS;
    }
  }

  return rf[0];
}